

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

int smf::MidiFile::secondsearch(void *A,void *B)

{
  _TickTime *b;
  _TickTime *a;
  void *B_local;
  void *A_local;
  
  if (*(double *)((long)B + 8) <= *(double *)((long)A + 8)) {
    if (*(double *)((long)A + 8) < *(double *)((long)B + 8) ||
        *(double *)((long)A + 8) == *(double *)((long)B + 8)) {
      A_local._4_4_ = 0;
    }
    else {
      A_local._4_4_ = 1;
    }
  }
  else {
    A_local._4_4_ = -1;
  }
  return A_local._4_4_;
}

Assistant:

int MidiFile::secondsearch(const void* A, const void* B) {
	_TickTime& a = *((_TickTime*)A);
	_TickTime& b = *((_TickTime*)B);

	if (a.seconds < b.seconds) {
		return -1;
	} else if (a.seconds > b.seconds) {
		return 1;
	}
	return 0;
}